

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O3

MMDB_entry_data_list_s * test_float_value(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_list_s *pMVar1;
  
  pMVar1 = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x5f,(pMVar1->entry_data).type,"==",0xf,"\'float\' key\'s value is a float",0);
  compare_float((pMVar1->entry_data).field_1.float_value,1.1);
  return pMVar1;
}

Assistant:

MMDB_entry_data_list_s *
test_float_value(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *value = entry_data_list = entry_data_list->next;

    cmp_ok(value->entry_data.type,
           "==",
           MMDB_DATA_TYPE_FLOAT,
           "'float' key's value is a float");

    compare_float(value->entry_data.float_value, 1.1F);

    return entry_data_list;
}